

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::Pow::backward_impl
          (Pow *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  size_type sVar1;
  const_reference ppTVar2;
  NoAlias<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::MatrixBase>
  other;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  int in_R8D;
  double __x;
  float x2;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x1;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffbd8;
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_pow_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,__1,_0,__1,__1>_>_>_>
  *in_stack_fffffffffffffbe8;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffbf0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_pow_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,__1,_0,__1,__1>_>_>_>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffbf8;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffc00;
  Tensor *in_stack_fffffffffffffc08;
  StorageBaseType *in_stack_fffffffffffffc20;
  ArrayBase<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffc28;
  ArrayBase<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  local_3c0 [452];
  float local_1fc;
  float local_54;
  int local_24;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *local_10;
  
  local_24 = in_R8D;
  local_10 = in_RSI;
  sVar1 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::size(in_RSI);
  if (sVar1 == 2) {
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](local_10,0);
    Tensor::operator*(in_stack_fffffffffffffc08);
    ppTVar2 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                        (local_10,1);
    local_54 = *(*ppTVar2)->v;
    __x = (double)(ulong)(uint)local_54;
    if (local_24 == 0) {
      Eigen::
      MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
      array((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
             *)in_stack_fffffffffffffbe8);
      local_1fc = local_54 - 1.0;
      Eigen::
      ArrayBase<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>_>
      ::pow<float>(in_stack_fffffffffffffc28,(float *)in_stack_fffffffffffffc20);
      Eigen::
      ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_pow_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,_-1,_-1,_0,_-1,_-1>_>_>_>
      ::matrix(in_stack_fffffffffffffbe8);
      Eigen::operator*((float *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
      Tensor::operator*(in_stack_fffffffffffffc08);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,-1,0,-1,-1>const>const,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_pow_op<float,float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Array<float,-1,-1,0,-1,-1>const>const>const>const>>
      ::cwiseProduct<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                ((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_pow_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,__1,_0,__1,__1>_>_>_>_>_>
                  *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
      Tensor::operator*(in_stack_fffffffffffffc08);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
      operator+=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
    }
    else {
      Tensor::operator*(in_stack_fffffffffffffc08);
      Eigen::
      MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
      array((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
             *)in_stack_fffffffffffffbe8);
      Eigen::
      ArrayBase<Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>_>
      ::log(local_3c0,__x);
      Eigen::
      ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
      ::matrix((ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
                *)in_stack_fffffffffffffbe8);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
      cwiseProduct<Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>const>const>>
                ((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)in_stack_fffffffffffffc08,
                 (MatrixBase<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
                  *)in_stack_fffffffffffffc00);
      Eigen::
      DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
      ::transpose((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
                   *)in_stack_fffffffffffffbe8);
      Tensor::operator*(in_stack_fffffffffffffc08);
      Eigen::
      MatrixBase<Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const,Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<float>,Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>const>const>const>const>>
      ::operator*((MatrixBase<Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>_>
                   *)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      Tensor::operator*(in_stack_fffffffffffffc08);
      other = Eigen::
              MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
              ::noalias(in_stack_fffffffffffffbd8);
      Eigen::
      NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
      ::operator+=((NoAlias<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::MatrixBase>
                    *)in_stack_fffffffffffffc00,
                   (MatrixBase<Eigen::Product<Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                    *)other.m_expression);
    }
    return;
  }
  __assert_fail("xs.size() == 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                ,0x72,
                "virtual void cnn::Pow::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
               );
}

Assistant:

void Pow::backward_impl(const vector<const Tensor*>& xs,
                        const Tensor& fx,
                        const Tensor& dEdf,
                        unsigned i,
                        Tensor& dEdxi) const {
  assert(xs.size() == 2);
#ifdef HAVE_CUDA
  throw std::runtime_error("Pow not yet implemented for CUDA");
#else
  auto x1 = **xs[0];
  auto x2 = xs[1]->v[0];
  if (i == 0) {
    *dEdxi += (x2 * x1.array().pow(x2 - 1).matrix()).cwiseProduct(*dEdf);
  } else {
    // y = a^x
    // dy/dx = a^x * log(a)
    (*dEdxi).noalias() += (*fx).cwiseProduct(x1.array().log().matrix()).transpose() * (*dEdf);
  }
#endif
}